

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O0

void connection_close_cb(uv_handle_t *handle)

{
  void *__ptr;
  int iVar1;
  connection_context_t *context;
  uv_handle_t *handle_local;
  
  __ptr = handle->data;
  iVar1 = *(int *)((long)__ptr + 0x154) + -1;
  *(int *)((long)__ptr + 0x154) = iVar1;
  if (iVar1 == 0) {
    if ((test_mode == DUPLEX) || (*(int *)((long)__ptr + 0x150) != 0)) {
      if (*(long *)((long)__ptr + 0x140) != 0x10000) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll.c"
                ,0xb6,"context->read == TRANSFER_BYTES");
        abort();
      }
    }
    else if (*(long *)((long)__ptr + 0x140) != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll.c"
              ,0xb8,"context->read == 0");
      abort();
    }
    if ((test_mode == DUPLEX) || (*(int *)((long)__ptr + 0x150) == 0)) {
      if (*(long *)((long)__ptr + 0x148) != 0x10000) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll.c"
                ,0xbc,"context->sent == TRANSFER_BYTES");
        abort();
      }
    }
    else if (*(long *)((long)__ptr + 0x148) != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll.c"
              ,0xbe,"context->sent == 0");
      abort();
    }
    closed_connections = closed_connections + 1;
    free(__ptr);
  }
  return;
}

Assistant:

static void connection_close_cb(uv_handle_t* handle) {
  connection_context_t* context = (connection_context_t*) handle->data;

  if (--context->open_handles == 0) {
    if (test_mode == DUPLEX || context->is_server_connection) {
      ASSERT(context->read == TRANSFER_BYTES);
    } else {
      ASSERT(context->read == 0);
    }

    if (test_mode == DUPLEX || !context->is_server_connection) {
      ASSERT(context->sent == TRANSFER_BYTES);
    } else {
      ASSERT(context->sent == 0);
    }

    closed_connections++;

    free(context);
  }
}